

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O1

ActionResults * __thiscall BlueRoomFourAction::Throw(BlueRoomFourAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *pAVar3;
  itemType local_3c;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == ROPE) {
    local_3c = ROPE;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_3c);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 != HIDDEN) {
      pAVar3 = (ActionResults *)operator_new(0x30);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,
                 "You comically try and toss the rope as far as you can. Being attached to the floor, it doesn\'t work well."
                 ,"");
      ActionResults::ActionResults(pAVar3,CURRENT,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return pAVar3;
      }
      operator_delete(local_38._M_dataplus._M_p);
      return pAVar3;
    }
  }
  pAVar3 = AbstractRoomAction::Throw(&this->super_AbstractRoomAction);
  return pAVar3;
}

Assistant:

ActionResults * BlueRoomFourAction::Throw() {
    if(commands->getMainItem() == ROPE && itemList->getValue(ROPE)->getLocation() != HIDDEN){
        return new ActionResults(CURRENT, "You comically try and toss the rope as far as you can. Being attached to the floor, it doesn't work well.");
    } else {
        return AbstractRoomAction::Throw();
    }
}